

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutCardWhenNoneIsSelected_Test::TestBody
          (StockPileWithCardsTest_tryPullOutCardWhenNoneIsSelected_Test *this)

{
  void *pvVar1;
  undefined4 extraout_var;
  uint extraout_var_00;
  byte extraout_DL;
  pointer *__ptr;
  char *pcVar2;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pointer local_58;
  _Storage<solitaire::cards::Card,_true> local_50 [2];
  long local_40;
  AssertHelper local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_28;
  
  local_50[0]._0_4_ =
       (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
           super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_StockPile).super_Archiver._vptr_Archiver[5])();
  local_50[0]._M_value.suit = extraout_var;
  if ((extraout_DL & 1) == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::CmpHelperEQFailure<std::optional<solitaire::cards::Card>,std::nullopt_t>
              ((internal *)local_68,"pile->tryPullOutCard()","std::nullopt",
               (optional<solitaire::cards::Card> *)&local_50[0]._M_value,(nullopt_t *)&std::nullopt)
    ;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50[0]._M_value);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50[0]._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_50[0].field2 != (long *)0x0) {
      (**(code **)(*(long *)local_50[0] + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68,
             &(this->super_StockPileWithCardsTest).pileCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_28,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68);
  pvVar1 = (void *)CONCAT71(local_68._1_7_,local_68[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_58 - (long)pvVar1);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68,
             &local_28);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &local_50[0]._M_value,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68);
  pvVar1 = (void *)CONCAT71(local_68._1_7_,local_68[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_58 - (long)pvVar1);
  }
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&local_38,(char *)local_50,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  if ((long *)local_50[0].field2 != (long *)0x0) {
    operator_delete((void *)local_50[0],local_40 - (long)local_50[0]);
  }
  if (local_28.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_38.data_ == '\0') {
    testing::Message::Message((Message *)local_68);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50[0]._M_value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_50[0]._M_value,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50[0]._M_value);
    if ((long *)CONCAT71(local_68._1_7_,local_68[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_68._1_7_,local_68[0]) + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_50[0]._0_4_ =
       (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
           super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_50[0]._M_value.suit = extraout_var_00;
  if ((extraout_var_00 & 1) == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::CmpHelperEQFailure<std::optional<unsigned_int>,std::nullopt_t>
              ((internal *)local_68,"pile->getSelectedCardIndex()","std::nullopt",
               (optional<unsigned_int> *)&local_50[0]._M_value,(nullopt_t *)&std::nullopt);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50[0]._M_value);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50[0]._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_50[0].field2 != (long *)0x0) {
      (**(code **)(*(long *)local_50[0] + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutCardWhenNoneIsSelected) {
    EXPECT_EQ(pile->tryPullOutCard(), std::nullopt);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), std::nullopt);
}